

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t linear_hash_get_bucket_swap_record
                    (int bucket_idx,ion_fpos_t *record_loc,ion_byte_t *key,ion_byte_t *value,
                    ion_byte_t *status,linear_hash_table_t *linear_hash)

{
  ion_err_t iVar1;
  ion_fpos_t bucket_loc;
  long loc;
  ion_byte_t deleted_status;
  linear_hash_bucket_t bucket;
  
  if (bucket_idx < linear_hash->bucket_map->current_size) {
    bucket_loc = linear_hash->bucket_map->data[bucket_idx];
  }
  else {
    bucket_loc = -1;
  }
  linear_hash_get_bucket(bucket_loc,&bucket,linear_hash);
  loc = linear_hash->record_total_size * ((long)bucket.record_count + -1) + bucket_loc + 0x10;
  iVar1 = linear_hash_get_record(loc,key,value,status,linear_hash);
  if (iVar1 == '\0') {
    deleted_status = '\0';
    iVar1 = linear_hash_write_record(loc,key,value,&deleted_status,linear_hash);
    if (iVar1 == '\0') {
      *record_loc = loc;
      bucket.record_count = (int)((long)bucket.record_count + -1);
      if (bucket.overflow_location != -1 && bucket.record_count == 0) {
        array_list_insert(bucket.idx,bucket.overflow_location,linear_hash->bucket_map);
      }
      iVar1 = linear_hash_update_bucket(bucket_loc,&bucket,linear_hash);
      linear_hash->num_records = linear_hash->num_records + -1;
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
linear_hash_get_bucket_swap_record(
	int					bucket_idx,
	ion_fpos_t			*record_loc,
	ion_byte_t			*key,
	ion_byte_t			*value,
	ion_byte_t			*status,
	linear_hash_table_t *linear_hash
) {
	/* read in bucket currently swapping to obtain the last record */
	ion_fpos_t				bucket_loc = array_list_get(bucket_idx, linear_hash->bucket_map);
	linear_hash_bucket_t	bucket;

	linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	ion_fpos_t swap_record_loc	= bucket_loc + sizeof(linear_hash_bucket_t) + ((bucket.record_count - 1) * linear_hash->record_total_size);

	/* read in the record to swap with next */
	ion_err_t err				= linear_hash_get_record(swap_record_loc, key, value, status, linear_hash);

	if (err != err_ok) {
		return err;
	}

	ion_byte_t deleted_status = linear_hash_record_status_empty;

	/* TODO JUST NEED TO WRITE STATUS HERE */
	err = linear_hash_write_record(swap_record_loc, key, value, &deleted_status, linear_hash);

	if (err != err_ok) {
		return err;
	}

	*record_loc = swap_record_loc;
	bucket.record_count--;

	/* garuntee the bucket in the bucket map has records in it - THIS LEAVES EMPTY BUCKETS FLOATING ABOUT */
	if ((bucket.record_count == 0) && (bucket.overflow_location != linear_hash_end_of_list)) {
		array_list_insert(bucket.idx, bucket.overflow_location, linear_hash->bucket_map);
	}

	/* only to update bucket if not becoming junk bucket */
	err = linear_hash_update_bucket(bucket_loc, &bucket, linear_hash);
	linear_hash_decrement_num_records(linear_hash);

	if (err != err_ok) {
		return err;
	}

	return err;
}